

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_lnx_Udev.cpp
# Opt level: O0

void __thiscall axl::sys::lnx::libudev::UdevLib::UdevLib(UdevLib *this)

{
  bool bVar1;
  uint uVar2;
  DynamicLib *in_RDI;
  uint7 in_stack_ffffffffffffff78;
  byte bVar3;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *in_stack_ffffffffffffff80;
  char local_58 [48];
  char local_28 [40];
  
  psx::DynamicLib::DynamicLib((DynamicLib *)0x1ad911);
  bVar1 = false;
  bVar3 = 0;
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
            (in_stack_ffffffffffffff80,(C *)(ulong)in_stack_ffffffffffffff78);
  uVar2 = psx::DynamicLib::open(in_RDI,local_28,1);
  if ((uVar2 & 1) == 0) {
    sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
              (in_stack_ffffffffffffff80,(C *)CONCAT17(bVar3,in_stack_ffffffffffffff78));
    bVar1 = true;
    uVar2 = psx::DynamicLib::open(in_RDI,local_58,1);
    if ((uVar2 & 1) == 0) {
      sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
                (in_stack_ffffffffffffff80,(C *)CONCAT17(bVar3,in_stack_ffffffffffffff78));
      bVar3 = 1;
      psx::DynamicLib::open(in_RDI,&stack0xffffffffffffff80,1);
    }
  }
  if ((bVar3 & 1) != 0) {
    sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
              ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x1ad9d1);
  }
  if (bVar1) {
    sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
              ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x1ad9e4);
  }
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
            ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x1ad9ee);
  return;
}

Assistant:

UdevLib() {
		open("libudev.so") ||
		open("libudev.so.1") ||
		open("libudev.so.0");
	}